

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc.c++
# Opt level: O0

Client __thiscall capnp::EzRpcClient::importCap(EzRpcClient *this,StringPtr name)

{
  Impl *pIVar1;
  ClientContext *pCVar2;
  Type *in_RCX;
  ClientHook *extraout_RDX;
  Own<capnp::EzRpcClient::Impl::ClientContext> *this_00;
  Client CVar4;
  StringPtr value;
  StringPtr name_00;
  String local_c0;
  EzRpcClient *local_a8;
  char *pcStack_a0;
  String local_98;
  CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_ez_rpc_c__:181:9),_kj::String>
  local_80;
  undefined1 local_60 [32];
  EzRpcClient *local_40;
  char *local_38;
  Own<capnp::EzRpcClient::Impl::ClientContext> *local_30;
  Own<capnp::EzRpcClient::Impl::ClientContext> *client;
  EzRpcClient *this_local;
  StringPtr name_local;
  ClientHook *pCVar3;
  
  this_local = (EzRpcClient *)name.content.size_;
  this_00 = (Own<capnp::EzRpcClient::Impl::ClientContext> *)name.content.ptr;
  client = this_00;
  name_local.content.ptr = (char *)in_RCX;
  name_local.content.size_ = (size_t)this;
  pIVar1 = kj::Own<capnp::EzRpcClient::Impl>::operator->((Own<capnp::EzRpcClient::Impl> *)this_00);
  local_30 = kj::_::readMaybe<capnp::EzRpcClient::Impl::ClientContext>(&pIVar1->clientContext);
  if (local_30 == (Own<capnp::EzRpcClient::Impl::ClientContext> *)0x0) {
    kj::Own<capnp::EzRpcClient::Impl>::operator->((Own<capnp::EzRpcClient::Impl> *)this_00);
    kj::ForkedPromise<void>::addBranch((ForkedPromise<void> *)local_60);
    local_a8 = this_local;
    pcStack_a0 = name_local.content.ptr;
    value.content.size_ = (size_t)in_RCX;
    value.content.ptr = name_local.content.ptr;
    kj::heapString(&local_98,(kj *)this_local,value);
    local_c0.content.ptr = (char *)this_00;
    kj::mvCapture<capnp::EzRpcClient::importCap(kj::StringPtr)::__0,kj::String>
              (&local_80,(kj *)&local_98,&local_c0,in_RCX);
    kj::Promise<void>::
    then<kj::CaptureByMove<capnp::EzRpcClient::importCap(kj::StringPtr)::__0,kj::String>,kj::_::PropagateException>
              ((Promise<void> *)(local_60 + 0x10),
               (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_ez_rpc_c__:181:9),_kj::String>
                *)local_60,(PropagateException *)&local_80);
    Capability::Client::Client<capnp::Capability::Client,void>
              ((Client *)this,(Promise<capnp::Capability::Client> *)(local_60 + 0x10));
    kj::Promise<capnp::Capability::Client>::~Promise
              ((Promise<capnp::Capability::Client> *)(local_60 + 0x10));
    kj::
    CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc.c++:181:9),_kj::String>
    ::~CaptureByMove(&local_80);
    kj::String::~String(&local_98);
    kj::Promise<void>::~Promise((Promise<void> *)local_60);
    pCVar3 = extraout_RDX;
  }
  else {
    pCVar2 = kj::Own<capnp::EzRpcClient::Impl::ClientContext>::get(local_30);
    local_40 = this_local;
    local_38 = name_local.content.ptr;
    name_00.content.size_ = (size_t)this_local;
    name_00.content.ptr = (char *)pCVar2;
    CVar4 = Impl::ClientContext::restore((ClientContext *)this,name_00);
    pCVar3 = CVar4.hook.ptr;
  }
  CVar4.hook.ptr = pCVar3;
  CVar4.hook.disposer = (Disposer *)this;
  return (Client)CVar4.hook;
}

Assistant:

Capability::Client EzRpcClient::importCap(kj::StringPtr name) {
  KJ_IF_MAYBE(client, impl->clientContext) {
    return client->get()->restore(name);
  } else {
    return impl->setupPromise.addBranch().then(kj::mvCapture(kj::heapString(name),
        [this](kj::String&& name) {
      return KJ_ASSERT_NONNULL(impl->clientContext)->restore(name);
    }));
  }
}